

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int IncreasePreviousDuration(WebPAnimEncoder *enc,int duration)

{
  int iVar1;
  EncodedFrame *pEVar2;
  int in_ESI;
  WebPAnimEncoder *in_RDI;
  bool bVar3;
  EncodedFrame *curr_enc_frame;
  int can_use_lossless;
  WebPData lossy_1x1;
  uint8_t lossy_1x1_bytes [72];
  WebPData lossless_1x1;
  uint8_t lossless_1x1_bytes [28];
  FrameRectangle rect;
  int new_duration;
  EncodedFrame *prev_enc_frame;
  size_t position;
  WebPData *src;
  WebPData local_c8;
  uint8_t local_b8 [80];
  WebPData local_68;
  uint8_t local_58 [28];
  undefined8 local_3c;
  undefined8 local_34;
  int local_2c;
  EncodedFrame *local_28;
  size_t local_20;
  int local_14;
  WebPAnimEncoder *local_10;
  
  local_20 = in_RDI->count_ - 1;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_28 = GetFrame(in_RDI,local_20);
  local_2c = (local_28->sub_frame_).duration + local_14;
  if (local_2c < 0x1000000) {
    (local_28->sub_frame_).duration = local_2c;
    (local_28->key_frame_).duration = local_2c;
  }
  else {
    local_3c = 0;
    local_34 = 0x100000001;
    builtin_memcpy(local_58,"RIFF\x14",6);
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = 'W';
    local_58[9] = 'E';
    local_58[10] = 'B';
    local_58[0xb] = 'P';
    local_58[0xc] = 'V';
    local_58[0xd] = 'P';
    local_58[0xe] = '8';
    local_58[0xf] = 'L';
    local_58[0x10] = '\b';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '/';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\x10';
    local_58[0x19] = 0x88;
    local_58[0x1a] = 0x88;
    local_58[0x1b] = '\b';
    local_68.bytes = local_58;
    local_68.size = 0x1c;
    memcpy(local_b8,"RIFF@",0x48);
    local_c8.bytes = local_b8;
    local_c8.size = 0x48;
    bVar3 = true;
    if ((local_10->last_config_).lossless == 0) {
      bVar3 = (local_10->options_).allow_mixed != 0;
    }
    pEVar2 = GetFrame(local_10,local_10->count_);
    pEVar2->is_key_frame_ = 0;
    (pEVar2->sub_frame_).id = WEBP_CHUNK_ANMF;
    (pEVar2->sub_frame_).x_offset = 0;
    (pEVar2->sub_frame_).y_offset = 0;
    (pEVar2->sub_frame_).dispose_method = WEBP_MUX_DISPOSE_NONE;
    (pEVar2->sub_frame_).blend_method = WEBP_MUX_BLEND;
    (pEVar2->sub_frame_).duration = local_14;
    if (bVar3) {
      src = &local_68;
    }
    else {
      src = &local_c8;
    }
    iVar1 = WebPDataCopy(src,(WebPData *)0x1a0d9f);
    if (iVar1 == 0) {
      return 0;
    }
    local_10->count_ = local_10->count_ + 1;
    local_10->count_since_key_frame_ = local_10->count_since_key_frame_ + 1;
    local_10->flush_count_ = local_10->count_ - 1;
    local_10->prev_candidate_undecided_ = 0;
    (local_10->prev_rect_).x_offset_ = (undefined4)local_3c;
    (local_10->prev_rect_).y_offset_ = local_3c._4_4_;
    (local_10->prev_rect_).width_ = (undefined4)local_34;
    (local_10->prev_rect_).height_ = local_34._4_4_;
  }
  return 1;
}

Assistant:

static int IncreasePreviousDuration(WebPAnimEncoder* const enc, int duration) {
  const size_t position = enc->count_ - 1;
  EncodedFrame* const prev_enc_frame = GetFrame(enc, position);
  int new_duration;

  assert(enc->count_ >= 1);
  assert(!prev_enc_frame->is_key_frame_ ||
         prev_enc_frame->sub_frame_.duration ==
         prev_enc_frame->key_frame_.duration);
  assert(prev_enc_frame->sub_frame_.duration ==
         (prev_enc_frame->sub_frame_.duration & (MAX_DURATION - 1)));
  assert(duration == (duration & (MAX_DURATION - 1)));

  new_duration = prev_enc_frame->sub_frame_.duration + duration;
  if (new_duration >= MAX_DURATION) {  // Special case.
    // Separate out previous frame from earlier merged frames to avoid overflow.
    // We add a 1x1 transparent frame for the previous frame, with blending on.
    const FrameRectangle rect = { 0, 0, 1, 1 };
    const uint8_t lossless_1x1_bytes[] = {
      0x52, 0x49, 0x46, 0x46, 0x14, 0x00, 0x00, 0x00, 0x57, 0x45, 0x42, 0x50,
      0x56, 0x50, 0x38, 0x4c, 0x08, 0x00, 0x00, 0x00, 0x2f, 0x00, 0x00, 0x00,
      0x10, 0x88, 0x88, 0x08
    };
    const WebPData lossless_1x1 = {
      lossless_1x1_bytes, sizeof(lossless_1x1_bytes)
    };
    const uint8_t lossy_1x1_bytes[] = {
      0x52, 0x49, 0x46, 0x46, 0x40, 0x00, 0x00, 0x00, 0x57, 0x45, 0x42, 0x50,
      0x56, 0x50, 0x38, 0x58, 0x0a, 0x00, 0x00, 0x00, 0x10, 0x00, 0x00, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x41, 0x4c, 0x50, 0x48, 0x02, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x56, 0x50, 0x38, 0x20, 0x18, 0x00, 0x00, 0x00,
      0x30, 0x01, 0x00, 0x9d, 0x01, 0x2a, 0x01, 0x00, 0x01, 0x00, 0x02, 0x00,
      0x34, 0x25, 0xa4, 0x00, 0x03, 0x70, 0x00, 0xfe, 0xfb, 0xfd, 0x50, 0x00
    };
    const WebPData lossy_1x1 = { lossy_1x1_bytes, sizeof(lossy_1x1_bytes) };
    const int can_use_lossless =
        (enc->last_config_.lossless || enc->options_.allow_mixed);
    EncodedFrame* const curr_enc_frame = GetFrame(enc, enc->count_);
    curr_enc_frame->is_key_frame_ = 0;
    curr_enc_frame->sub_frame_.id = WEBP_CHUNK_ANMF;
    curr_enc_frame->sub_frame_.x_offset = 0;
    curr_enc_frame->sub_frame_.y_offset = 0;
    curr_enc_frame->sub_frame_.dispose_method = WEBP_MUX_DISPOSE_NONE;
    curr_enc_frame->sub_frame_.blend_method = WEBP_MUX_BLEND;
    curr_enc_frame->sub_frame_.duration = duration;
    if (!WebPDataCopy(can_use_lossless ? &lossless_1x1 : &lossy_1x1,
                      &curr_enc_frame->sub_frame_.bitstream)) {
      return 0;
    }
    ++enc->count_;
    ++enc->count_since_key_frame_;
    enc->flush_count_ = enc->count_ - 1;
    enc->prev_candidate_undecided_ = 0;
    enc->prev_rect_ = rect;
  } else {                           // Regular case.
    // Increase duration of the previous frame by 'duration'.
    prev_enc_frame->sub_frame_.duration = new_duration;
    prev_enc_frame->key_frame_.duration = new_duration;
  }
  return 1;
}